

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::mark_aligned_access
          (PhysicalStorageBufferPointerHandler *this,uint32_t id,uint32_t *args,uint32_t length)

{
  uint uVar1;
  PhysicalBlockMeta *pPVar2;
  
  if (length != 1) {
    uVar1 = *args;
    if (((uVar1 & 2) != 0) && ((length == 2 & (byte)uVar1) == 0)) {
      uVar1 = args[(ulong)(uVar1 & 1) + 1];
      pPVar2 = find_block_meta(this,id);
      if ((pPVar2 != (PhysicalBlockMeta *)0x0) && (pPVar2->alignment < uVar1)) {
        pPVar2->alignment = uVar1;
      }
    }
  }
  return;
}

Assistant:

void Compiler::PhysicalStorageBufferPointerHandler::mark_aligned_access(uint32_t id, const uint32_t *args, uint32_t length)
{
	uint32_t mask = *args;
	args++;
	length--;
	if (length && (mask & MemoryAccessVolatileMask) != 0)
	{
		args++;
		length--;
	}

	if (length && (mask & MemoryAccessAlignedMask) != 0)
	{
		uint32_t alignment = *args;
		auto *meta = find_block_meta(id);

		// This makes the assumption that the application does not rely on insane edge cases like:
		// Bind buffer with ADDR = 8, use block offset of 8 bytes, load/store with 16 byte alignment.
		// If we emit the buffer with alignment = 16 here, the first element at offset = 0 should
		// actually have alignment of 8 bytes, but this is too theoretical and awkward to support.
		// We could potentially keep track of any offset in the access chain, but it's
		// practically impossible for high level compilers to emit code like that,
		// so deducing overall alignment requirement based on maximum observed Alignment value is probably fine.
		if (meta && alignment > meta->alignment)
			meta->alignment = alignment;
	}
}